

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

void dg::vr::RelationsAnalyzer::inferFromPreds
               (VRLocation *location,Handle lt,Relations known,Handle rt)

{
  pointer ppVVar1;
  VRLocation *pVVar2;
  VectorSet<const_llvm::Value_*> *pVVar3;
  _Base_bitset<1UL> _Var4;
  _Link_type p_Var5;
  _Link_type p_Var6;
  pointer ppVVar7;
  pointer ppVVar8;
  _Rb_tree_header *p_Var9;
  ValueRelations *this;
  bool bVar10;
  size_t rtId;
  size_t ltId;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  setEqual;
  Value *local_a8;
  Value *local_a0;
  ValueRelations *local_98;
  VRLocation *local_90;
  _Base_bitset<1UL> local_88;
  Handle local_80;
  pointer local_78;
  ValueRelations *local_70;
  Handle local_68;
  _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  local_60;
  
  local_88._M_w = (_WordT)known.bits.super__Base_bitset<1UL>._M_w;
  pVVar2 = VRLocation::getTreePredecessor(location);
  this = &pVVar2->relations;
  local_98 = &location->relations;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90 = location;
  local_80 = lt;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pVVar3 = ValueRelations::getEqual(this,lt);
  ppVVar7 = (pVVar3->vec).
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar8 = (pVVar3->vec).
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppVVar7 != ppVVar8) {
    local_78 = ppVVar8;
    local_70 = this;
    local_68 = rt;
    do {
      p_Var9 = &local_60._M_impl.super__Rb_tree_header;
      local_a0 = *ppVVar7;
      p_Var5 = (_Link_type)p_Var9;
      for (p_Var6 = (_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var6 != (_Link_type)0x0;
          p_Var6 = *(_Link_type *)(&p_Var6->_M_storage)[(ulong)bVar10 - 2]._M_storage) {
        bVar10 = *(Value **)(p_Var6->_M_storage)._M_storage < local_a0;
        if (!bVar10) {
          p_Var5 = p_Var6;
        }
      }
      p_Var6 = (_Link_type)p_Var9;
      if (((_Rb_tree_header *)p_Var5 != p_Var9) &&
         (p_Var6 = p_Var5, local_a0 < *(Value **)(p_Var5->_M_storage)._M_storage)) {
        p_Var6 = (_Link_type)p_Var9;
      }
      if ((_Rb_tree_header *)p_Var6 == p_Var9) {
        pVVar3 = ValueRelations::getEqual(this,rt);
        ppVVar1 = (pVVar3->vec).
                  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppVVar8 = (pVVar3->vec).
                       super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; rt = local_68, this = local_70,
            ppVVar8 != ppVVar1; ppVVar8 = ppVVar8 + 1) {
          local_a8 = *ppVVar8;
          if ((local_a0 != local_a8) &&
             (_Var4._M_w = (_WordT)getCommon<llvm::Value_const*,llvm::Value_const*>
                                             (local_90,&local_a0,local_88._M_w,&local_a8),
             (_Base_bitset<1UL>)_Var4._M_w != (_Base_bitset<1UL>)0x0)) {
            if ((_Var4._M_w & 1) != 0) {
              std::
              _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
              ::_M_emplace_unique<llvm::Value_const*&>
                        ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                          *)&local_60,&local_a8);
            }
            ValueRelations::set<llvm::Value_const*,llvm::Value_const*>
                      (local_98,&local_a0,(Relations)_Var4._M_w,&local_a8);
          }
        }
        local_a8 = (Value *)ValueRelations::getBorderId(local_70,local_68);
        ppVVar8 = local_78;
        if ((local_a8 != (Value *)0xffffffffffffffff) &&
           (_Var4._M_w = (_WordT)getCommon<llvm::Value_const*,unsigned_long>
                                           (local_90,&local_a0,local_88._M_w,
                                            (unsigned_long *)&local_a8), ppVVar8 = local_78,
           (_Base_bitset<1UL>)_Var4._M_w != (_Base_bitset<1UL>)0x0)) {
          ValueRelations::set<llvm::Value_const*,unsigned_long>
                    (local_98,&local_a0,(Relations)_Var4._M_w,(unsigned_long *)&local_a8);
          ppVVar8 = local_78;
        }
      }
      ppVVar7 = ppVVar7 + 1;
    } while (ppVVar7 != ppVVar8);
  }
  local_a0 = (Value *)ValueRelations::getBorderId(this,local_80);
  if (local_a0 != (Value *)0xffffffffffffffff) {
    pVVar3 = ValueRelations::getEqual(this,rt);
    ppVVar7 = (pVVar3->vec).
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVVar8 = (pVVar3->vec).
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppVVar7 != ppVVar8) {
      do {
        local_a8 = *ppVVar7;
        _Var4._M_w = (_WordT)getCommon<unsigned_long,llvm::Value_const*>
                                       (local_90,(unsigned_long *)&local_a0,local_88._M_w,&local_a8)
        ;
        if ((_Base_bitset<1UL>)_Var4._M_w != (_Base_bitset<1UL>)0x0) {
          ValueRelations::set<unsigned_long,llvm::Value_const*>
                    (local_98,(unsigned_long *)&local_a0,(Relations)_Var4._M_w,&local_a8);
        }
        ppVVar7 = ppVVar7 + 1;
      } while (ppVVar7 != ppVVar8);
    }
    local_a8 = (Value *)ValueRelations::getBorderId(this,rt);
    if ((local_a8 != (Value *)0xffffffffffffffff) &&
       (_Var4._M_w = (_WordT)getCommon<unsigned_long,unsigned_long>
                                       (local_90,(unsigned_long *)&local_a0,local_88._M_w,
                                        (unsigned_long *)&local_a8),
       (_Base_bitset<1UL>)_Var4._M_w != (_Base_bitset<1UL>)0x0)) {
      ValueRelations::set<unsigned_long,unsigned_long>
                (local_98,(unsigned_long *)&local_a0,(Relations)_Var4._M_w,
                 (unsigned_long *)&local_a8);
    }
  }
  std::
  _Rb_tree<const_llvm::Value_*,_const_llvm::Value_*,_std::_Identity<const_llvm::Value_*>,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void RelationsAnalyzer::inferFromPreds(VRLocation &location, Handle lt,
                                       Relations known, Handle rt) {
    const ValueRelations &predGraph = location.getTreePredecessor().relations;
    ValueRelations &newGraph = location.relations;

    std::set<V> setEqual;
    for (const auto *ltVal : predGraph.getEqual(lt)) {
        if (setEqual.find(ltVal) != setEqual.end())
            continue;
        for (const auto *rtVal : predGraph.getEqual(rt)) {
            if (ltVal == rtVal)
                continue;

            Relations related = getCommon(location, ltVal, known, rtVal);
            if (!related.any())
                continue;

            if (related.has(Relations::EQ))
                setEqual.emplace(rtVal);
            newGraph.set(ltVal, related, rtVal);
        }

        size_t rtId = predGraph.getBorderId(rt);
        if (rtId != std::string::npos) {
            Relations related = getCommon(location, ltVal, known, rtId);
            if (!related.any())
                continue;

            newGraph.set(ltVal, related, rtId);
        }
    }

    size_t ltId = predGraph.getBorderId(lt);
    if (ltId != std::string::npos) {
        for (const auto *rtVal : predGraph.getEqual(rt)) {
            Relations related = getCommon(location, ltId, known, rtVal);
            if (!related.any())
                continue;

            newGraph.set(ltId, related, rtVal);
        }

        size_t rtId = predGraph.getBorderId(rt);
        if (rtId != std::string::npos) {
            Relations related = getCommon(location, ltId, known, rtId);
            if (!related.any())
                return;

            newGraph.set(ltId, related, rtId);
        }
    }
}